

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

double __thiscall
KMaxDistance::compute
          (KMaxDistance *this,double *xEdgeCosts,double *yEdgeCosts,int width,int height,
          int numDistMaxs,int *srcPixs,int numSrcPixs,int dstPix,double *dists,int *backPtrs,
          double *maxVector)

{
  double dVar1;
  int iVar2;
  MaxRec *pMVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  int numDistMaxs_00;
  void *__ptr;
  MaxRec **maxs;
  MaxRec *pMVar11;
  NodeAVL *pNVar12;
  undefined4 in_register_0000000c;
  void *pvVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  double *pdVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  double dVar26;
  NodeAVL *local_90;
  int local_84;
  KMaxDistance *local_80;
  int local_74;
  undefined8 local_70;
  double *local_68;
  ulong local_60;
  void *local_58;
  int local_4c;
  ulong local_48;
  double *local_40;
  double *local_38;
  
  local_70 = CONCAT44(in_register_0000000c,width);
  local_84 = height;
  local_80 = this;
  local_40 = xEdgeCosts;
  local_38 = yEdgeCosts;
  if (numDistMaxs < 0x29) {
    if (numDistMaxs < 1) {
      compute();
    }
    else {
      if (0 < numSrcPixs) {
        this->numMaxRecs = 0;
        this->numMaxRecsInOneNode = 0;
        this->numDistMaxsGl = numDistMaxs;
        local_74 = numDistMaxs;
        if (dists == (double *)0x0) {
          dists = (double *)malloc((long)(height * width) << 3);
        }
        uVar19 = local_84 * (int)local_70;
        local_68 = dists;
        maxs = (MaxRec **)malloc((long)(int)uVar19 * 8);
        local_58 = malloc((long)(int)uVar19 << 6);
        local_48 = (ulong)uVar19;
        local_60 = (ulong)uVar19;
        if (0 < (int)uVar19) {
          uVar16 = 0;
          memset(maxs,0,local_48 * 8);
          auVar22 = vpbroadcastq_avx512f();
          auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar24 = vbroadcastsd_avx512f(ZEXT816(0x4197d78400000000));
          do {
            auVar25 = vpbroadcastq_avx512f();
            auVar25 = vporq_avx512f(auVar25,auVar23);
            uVar18 = vpcmpuq_avx512f(auVar25,auVar22,2);
            pdVar21 = local_68 + uVar16;
            bVar4 = (bool)((byte)uVar18 & 1);
            bVar5 = (bool)((byte)(uVar18 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar18 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar18 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar18 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar18 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar18 >> 6) & 1);
            *pdVar21 = (double)((ulong)bVar4 * auVar24._0_8_ | (ulong)!bVar4 * (long)*pdVar21);
            pdVar21[1] = (double)((ulong)bVar5 * auVar24._8_8_ | (ulong)!bVar5 * (long)pdVar21[1]);
            pdVar21[2] = (double)((ulong)bVar6 * auVar24._16_8_ | (ulong)!bVar6 * (long)pdVar21[2]);
            pdVar21[3] = (double)((ulong)bVar7 * auVar24._24_8_ | (ulong)!bVar7 * (long)pdVar21[3]);
            pdVar21[4] = (double)((ulong)bVar8 * auVar24._32_8_ | (ulong)!bVar8 * (long)pdVar21[4]);
            pdVar21[5] = (double)((ulong)bVar9 * auVar24._40_8_ | (ulong)!bVar9 * (long)pdVar21[5]);
            pdVar21[6] = (double)((ulong)bVar10 * auVar24._48_8_ | (ulong)!bVar10 * (long)pdVar21[6]
                                 );
            pdVar21[7] = (double)((uVar18 >> 7) * auVar24._56_8_ |
                                 (ulong)!SUB81(uVar18 >> 7,0) * (long)pdVar21[7]);
            uVar16 = uVar16 + 8;
          } while (((int)local_60 + 7U & 0xfffffff8) != uVar16);
        }
        local_90 = (NodeAVL *)0x0;
        uVar16 = 1;
        if (1 < numSrcPixs) {
          uVar16 = (ulong)(uint)numSrcPixs;
        }
        uVar18 = 0;
        do {
          iVar14 = srcPixs[uVar18];
          pMVar11 = createNewMaxRec(local_80,iVar14,local_74);
          pMVar11->wasMin = 1;
          pNVar12 = avlInsert(&local_90,0.0,pMVar11);
          pMVar11->qPtr = pNVar12;
          maxs[iVar14] = pMVar11;
          if (local_58 != (void *)0x0) {
            auVar22 = vmovdqu64_avx512f((undefined1  [64])*pMVar11);
            auVar22 = vmovdqu64_avx512f(auVar22);
            *(undefined1 (*) [64])((long)local_58 + (long)iVar14 * 0x40) = auVar22;
          }
          uVar18 = uVar18 + 1;
        } while (uVar16 != uVar18);
        local_4c = (int)local_70 + -1;
        local_84 = local_84 + -1;
        iVar14 = 0;
        pdVar21 = local_68;
        do {
          if (local_90 == (NodeAVL *)0x0) break;
          pMVar11 = (MaxRec *)avlFindAndDeleteMin(&local_90);
          if (pMVar11->isUsed == 0) {
            bVar4 = false;
          }
          else {
            pMVar11->wasMin = 1;
            iVar2 = pMVar11->imgIdx;
            lVar17 = (long)iVar2;
            if (pMVar11->sumVals < pdVar21[lVar17]) {
              iVar14 = iVar14 + (uint)(99999999.99999999 < pdVar21[lVar17]);
              pdVar21[lVar17] = pMVar11->sumVals;
              *(MaxRec *)((long)local_58 + lVar17 * 0x40) = *pMVar11;
              bVar4 = true;
              if (iVar14 == (int)local_60) goto LAB_00104d2b;
            }
            if ((dstPix < 0) || (bVar4 = true, 100000000.0 <= pdVar21[(uint)dstPix])) {
              iVar20 = iVar2 / (int)local_70;
              iVar15 = iVar2 % (int)local_70;
              if (0 < iVar15) {
                addPathToNodeAVL(local_80,pMVar11,iVar2 + -1,local_40[lVar17 + -1],local_74,maxs,
                                 &local_90);
              }
              numDistMaxs_00 = local_74;
              if (iVar15 < local_4c) {
                addPathToNodeAVL(local_80,pMVar11,iVar2 + 1,local_40[lVar17],local_74,maxs,&local_90
                                );
              }
              if (0 < iVar20) {
                addPathToNodeAVL(local_80,pMVar11,iVar2 - (int)local_70,
                                 local_38[iVar2 - (int)local_70],numDistMaxs_00,maxs,&local_90);
              }
              if (iVar20 < local_84) {
                addPathToNodeAVL(local_80,pMVar11,iVar2 + (int)local_70,local_38[lVar17],
                                 numDistMaxs_00,maxs,&local_90);
              }
              bVar4 = false;
              pdVar21 = local_68;
            }
          }
LAB_00104d2b:
        } while (!bVar4);
        uVar16 = local_48;
        __ptr = local_58;
        uVar19 = -dstPix;
        if (0 < dstPix) {
          uVar19 = dstPix;
        }
        uVar18 = (ulong)uVar19;
        local_80 = (KMaxDistance *)pdVar21[uVar18];
        if (maxVector != (double *)0x0) {
          pMVar11 = maxs[uVar18];
          dVar26 = pMVar11->sumVals;
          iVar14 = pMVar11->numVals;
          if (0 < (long)iVar14) {
            lVar17 = 0;
            do {
              maxVector[lVar17] = pMVar11->vals[lVar17];
              lVar17 = lVar17 + 1;
            } while (iVar14 != lVar17);
          }
          while (pMVar11 = (MaxRec *)pMVar11->next, pMVar11 != (MaxRec *)0x0) {
            dVar1 = pMVar11->sumVals;
            if ((dVar1 < dVar26) && (iVar14 = pMVar11->numVals, dVar26 = dVar1, 0 < (long)iVar14)) {
              lVar17 = 0;
              do {
                maxVector[lVar17] = pMVar11->vals[lVar17];
                lVar17 = lVar17 + 1;
              } while (iVar14 != lVar17);
            }
          }
        }
        if (backPtrs != (int *)0x0) {
          if (local_58 == (void *)0x0) {
            uVar18 = 0;
          }
          else {
            pvVar13 = (void *)((long)local_58 + uVar18 * 0x40);
            uVar18 = 0;
            do {
              backPtrs[uVar18] = *(int *)((long)pvVar13 + 0x20);
              uVar18 = uVar18 + 1;
              pvVar13 = *(void **)((long)pvVar13 + 8);
            } while (pvVar13 != (void *)0x0);
            uVar18 = uVar18 & 0xffffffff;
          }
          backPtrs[uVar18] = -1;
        }
        if (local_90 != (NodeAVL *)0x0) {
          do {
            avlFindAndDeleteMin(&local_90);
          } while (local_90 != (NodeAVL *)0x0);
        }
        if (0 < (int)local_60) {
          uVar18 = 0;
          do {
            pMVar11 = maxs[uVar18];
            while (pMVar11 != (MaxRec *)0x0) {
              pMVar3 = (MaxRec *)pMVar11->next;
              free(pMVar11);
              pMVar11 = pMVar3;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar16);
        }
        free(maxs);
        free(local_90);
        free(__ptr);
        return (double)local_80;
      }
      compute();
    }
  }
  else {
    compute();
  }
  return 0.0;
}

Assistant:

double KMaxDistance::compute( const double *xEdgeCosts, const double *yEdgeCosts, const int width, const int height, const int numDistMaxs,
    const int *srcPixs, const int numSrcPixs, const int dstPix, double *dists, int* backPtrs, double *maxVector ){

    if ( numDistMaxs > MAX_NUM_MAXS ){ fprintf(stderr, "ERROR: numDistMaxs is too big (increase MAX_NUM_MAXS).\n" ); return 0.0; }
    if ( numDistMaxs < 1 ){ fprintf(stderr, "ERROR: numDistMaxs has to be positive.\n" ); return 0.0; }
    if ( numSrcPixs < 1 ){ fprintf(stderr, "ERROR: no source points found.\n" ); return 0.0; }

    numMaxRecs = 0;
    numMaxRecsInOneNode = 0;
    numDistMaxsGl = numDistMaxs;

	int cnt = 0;
    //double *dists;
    if ( dists == NULL ) dists = (double*)malloc( width*height*sizeof( dists[0] )); // else dists = distsExt; 
    MaxRec **maxs = (MaxRec**)malloc( width*height*sizeof( maxs[0] ));
    MaxRec* prevPtrs = (MaxRec*)malloc( width*height*sizeof( prevPtrs[0] ));
    
    for ( int i = 0; i < width*height; ++i ) 
    {
		maxs[i] = NULL;
		dists[i] = MAX_GEO_DIST;
	}

    NodeAVL *queue = NULL;

    for ( int i = 0; i < numSrcPixs; ++i ){
        int imgIdx = srcPixs[i];
        MaxRec *rec = createNewMaxRec( imgIdx, numDistMaxs );
        rec->wasMin = 1;
        rec->qPtr = avlInsert( &queue, 0.0, rec );
        maxs[imgIdx] = rec;
        if ( prevPtrs != NULL ) prevPtrs[imgIdx] = *rec;
    }

	
    while ( queue != NULL )
    {

        MaxRec *minDistRec = (MaxRec*)avlFindAndDeleteMin( &queue );

        if ( !minDistRec->isUsed ) continue;
        
        minDistRec->wasMin = 1;
        int imgIdx = minDistRec->imgIdx;
        
        if ( minDistRec->sumVals < dists[imgIdx] ){ 
            if ( dists[imgIdx] > MAX_GEO_DIST - GEO_MAX_EPSX ) cnt++;
            dists[imgIdx] = minDistRec->sumVals;
            prevPtrs[imgIdx] = *minDistRec;
            if ( cnt == width*height ) break;
        }
        
        if ( dstPix >= 0 ){ if ( dists[dstPix] < MAX_GEO_DIST ) break; }
        
        int y = imgIdx/width, x = imgIdx - y*width;
        if ( x > 0 )        addPathToNodeAVL( minDistRec,     imgIdx-1,     xEdgeCosts[imgIdx-1], numDistMaxs, maxs, &queue );
        if ( x < width-1 )  addPathToNodeAVL( minDistRec,     imgIdx+1,       xEdgeCosts[imgIdx], numDistMaxs, maxs, &queue );
        if ( y > 0 )        addPathToNodeAVL( minDistRec, imgIdx-width, yEdgeCosts[imgIdx-width], numDistMaxs, maxs, &queue );
        if ( y < height-1 ) addPathToNodeAVL( minDistRec, imgIdx+width,       yEdgeCosts[imgIdx], numDistMaxs, maxs, &queue );

    }


    double retVal = 0.0;
    retVal = dists[abs(dstPix)];

    if ( maxVector != NULL ) 
    {
        MaxRec* m = maxs[abs(dstPix)];
        double minSum = m->sumVals;
        for(int i = 0; i < m->numVals; i++) maxVector[i] = m->vals[i];

        while(m->next != NULL)
        {
            m = (MaxRec*) m->next;
            if(m->sumVals < minSum)
            {
                minSum = m->sumVals;
                for(int i = 0; i < m->numVals; i++) maxVector[i] = m->vals[i];
            }
        }
    }

    if ( backPtrs != NULL ) 
    {
        int backIdx = 0;
        MaxRec* backRec = &prevPtrs[abs(dstPix)];
        while(backRec != NULL)
        {
            backPtrs[backIdx++] = backRec->imgIdx;
            backRec = (MaxRec*) backRec->back;
        }
        backPtrs[backIdx++] = -1;
    }
    
    while ( queue != NULL ) avlFindAndDeleteMin( &queue );
    
    #ifdef DEBUG_MODE
    meanNumRecs = (double)numMaxRecs/(double)(width*height);
    maxNumRecsInNode = numMaxRecsInOneNode;
    printf("meanNumRecs: %.2lf\n", meanNumRecs);
    printf("maxNumRecsInNode: %d\n", maxNumRecsInNode);
    #endif

    for ( int i = 0; i < width*height; ++i ) freeMaxRecs( maxs[i] );
    free( maxs ); 
    free( queue );
    free( prevPtrs );
    //if ( distsExt == NULL ) free( dists );

    return retVal;

}